

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse.hpp
# Opt level: O2

bool argparse::Argument::is_float(string *aValue)

{
  uint *puVar1;
  uint uVar2;
  float tFloat;
  istringstream tStream;
  uint auStack_170 [90];
  
  std::__cxx11::istringstream::istringstream((istringstream *)&tStream,(string *)aValue,_S_in);
  puVar1 = (uint *)((long)auStack_170 + *(long *)(_tStream + -0x18));
  *puVar1 = *puVar1 & 0xffffefff;
  std::istream::_M_extract<float>((float *)&tStream);
  uVar2 = *(uint *)((long)auStack_170 + *(long *)(_tStream + -0x18) + 8);
  std::__cxx11::istringstream::~istringstream((istringstream *)&tStream);
  return (uVar2 & 7) == 2;
}

Assistant:

static bool is_float(const std::string &aValue) {
    std::istringstream tStream(aValue);
    float tFloat;
    // noskipws considers leading whitespace invalid
    tStream >> std::noskipws >> tFloat;
    // Check the entire string was consumed
    // and if either failbit or badbit is set
    return tStream.eof() && !tStream.fail();
  }